

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O0

MPP_RET hal_h265d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint local_34;
  RK_U32 max_cnt;
  RK_U32 i;
  HalH265dCtx *reg_ctx;
  RK_S32 ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,hevc_hor_align);
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_VER_ALIGN,hevc_ver_align);
  pvVar3 = mpp_osal_calloc("hal_h265d_vdpu382_init",1000);
  *(void **)((long)hal + 0x1a0) = pvVar3;
  if (*(long *)((long)hal + 0x1a0) == 0) {
    _mpp_log_l(2,"hal_h265d_vdpu382","scaling_org alloc fail",(char *)0x0);
    hal_local._4_4_ = MPP_ERR_MALLOC;
  }
  else {
    pvVar3 = mpp_osal_calloc("hal_h265d_vdpu382_init",0x550);
    *(void **)((long)hal + 0x198) = pvVar3;
    pvVar3 = mpp_osal_calloc("hal_h265d_vdpu382_init",0x78);
    *(void **)((long)hal + 0x208) = pvVar3;
    pvVar3 = mpp_osal_calloc("hal_h265d_vdpu382_init",0xc80);
    *(void **)((long)hal + 0x210) = pvVar3;
    if (*(long *)((long)hal + 0x198) == 0) {
      _mpp_log_l(2,"hal_h265d_vdpu382","scaling_rk alloc fail",(char *)0x0);
      hal_local._4_4_ = MPP_ERR_MALLOC;
    }
    else if ((*(long *)((long)hal + 0x30) == 0) &&
            (hal_local._4_4_ =
                  mpp_buffer_group_get
                            ((MppBufferGroup *)((long)hal + 0x30),MPP_BUFFER_TYPE_ION,
                             MPP_BUFFER_INTERNAL,"hal_h265d_vdpu382","hal_h265d_vdpu382_init"),
            hal_local._4_4_ != MPP_OK)) {
      _mpp_log_l(2,"hal_h265d_vdpu382","h265d mpp_buffer_group_get failed\n",(char *)0x0);
    }
    else {
      uVar1 = 1;
      if (*(int *)((long)hal + 0x180) != 0) {
        uVar1 = 3;
      }
      hal_local._4_4_ =
           mpp_buffer_get_with_tag
                     (*(MppBufferGroup *)((long)hal + 0x30),(MppBuffer *)((long)hal + 0x1c8),
                      (ulong)(uVar1 * 0x1e000 + 0x7000),"hal_h265d_vdpu382","hal_h265d_vdpu382_init"
                     );
      if (hal_local._4_4_ == MPP_OK) {
        iVar2 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu382_init");
        *(int *)((long)hal + 0x1d0) = iVar2;
        *(undefined4 *)((long)hal + 0x1d4) = 0;
        for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
          pvVar3 = mpp_osal_calloc("hal_h265d_vdpu382_init",700);
          *(void **)((long)hal + (ulong)local_34 * 0x28 + 0x128) = pvVar3;
          *(uint *)((long)hal + (ulong)local_34 * 4 + 0x1d8) = local_34 * 0x1e000 + 0x7000;
          *(uint *)((long)hal + (ulong)local_34 * 4 + 0x1e4) = local_34 * 0x1e000 + 0x9000;
          *(uint *)((long)hal + (ulong)local_34 * 4 + 0x1f0) = local_34 * 0x1e000 + 0xa000;
        }
        if (*(int *)((long)hal + 0x180) == 0) {
          *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0x128);
          *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + 0x1d8);
          *(undefined4 *)((long)hal + 0x200) = *(undefined4 *)((long)hal + 0x1e4);
          *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + 0x1f0);
        }
        hal_local._4_4_ =
             mpp_buffer_write_with_caller
                       (*(MppBuffer *)((long)hal + 0x1c8),0,cabac_table,0x6b40,
                        "hal_h265d_vdpu382_init");
        if (hal_local._4_4_ == MPP_OK) {
          if (cfg->hal_fbc_adj_cfg != (SlotHalFbcAdjCfg *)0x0) {
            cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
            cfg->hal_fbc_adj_cfg->expand = 0x10;
          }
          hal_local._4_4_ = MPP_OK;
        }
        else {
          _mpp_log_l(2,"hal_h265d_vdpu382","h265d write cabac_table data failed\n",(char *)0x0);
        }
      }
      else {
        _mpp_log_l(2,"hal_h265d_vdpu382","h265d mpp_buffer_get failed\n",(char *)0x0);
      }
    }
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    RK_S32 ret = 0;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;

    mpp_slots_set_prop(reg_ctx->slots, SLOTS_HOR_ALIGN, hevc_hor_align);
    mpp_slots_set_prop(reg_ctx->slots, SLOTS_VER_ALIGN, hevc_ver_align);

    reg_ctx->scaling_qm = mpp_calloc(DXVA_Qmatrix_HEVC, 1);
    if (reg_ctx->scaling_qm == NULL) {
        mpp_err("scaling_org alloc fail");
        return MPP_ERR_MALLOC;
    }

    reg_ctx->scaling_rk = mpp_calloc(scalingFactor_t, 1);
    reg_ctx->pps_buf = mpp_calloc(RK_U64, 15);
    reg_ctx->sw_rps_buf = mpp_calloc(RK_U64, 400);

    if (reg_ctx->scaling_rk == NULL) {
        mpp_err("scaling_rk alloc fail");
        return MPP_ERR_MALLOC;
    }

    if (reg_ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&reg_ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("h265d mpp_buffer_group_get failed\n");
            return ret;
        }
    }

    {
        RK_U32 i = 0;
        RK_U32 max_cnt = reg_ctx->fast_mode ? MAX_GEN_REG : 1;

        //!< malloc buffers
        ret = mpp_buffer_get(reg_ctx->group, &reg_ctx->bufs, ALL_BUFFER_SIZE(max_cnt));
        if (ret) {
            mpp_err("h265d mpp_buffer_get failed\n");
            return ret;
        }

        reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
        reg_ctx->offset_cabac = CABAC_TAB_OFFSET;
        for (i = 0; i < max_cnt; i++) {
            reg_ctx->g_buf[i].hw_regs = mpp_calloc_size(void, sizeof(Vdpu382H265dRegSet));
            reg_ctx->offset_spspps[i] = SPSPPS_OFFSET(i);
            reg_ctx->offset_rps[i] = RPS_OFFSET(i);
            reg_ctx->offset_sclst[i] = SCALIST_OFFSET(i);
        }
    }

    if (!reg_ctx->fast_mode) {
        reg_ctx->hw_regs = reg_ctx->g_buf[0].hw_regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    ret = mpp_buffer_write(reg_ctx->bufs, 0, (void*)cabac_table, sizeof(cabac_table));
    if (ret) {
        mpp_err("h265d write cabac_table data failed\n");
        return ret;
    }

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

#ifdef dump
    fp = fopen("/data/hal.bin", "wb");
#endif
    (void) cfg;
    return MPP_OK;
}